

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revsurface.hpp
# Opt level: O0

void __thiscall RevSurface::RevSurface(RevSurface *this,Json *json)

{
  undefined1 uVar1;
  bool bVar2;
  const_reference this_00;
  void *pvVar3;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_RDI;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  vec3f vVar4;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  p;
  const_iterator __end1;
  const_iterator __begin1;
  value_type *__range1;
  vector<vec3f,_std::allocator<vec3f>_> controls;
  value_type curvetype;
  ParamSurface *in_stack_00000500;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  float in_stack_fffffffffffffef4;
  undefined1 in_stack_fffffffffffffef8 [16];
  char *in_stack_ffffffffffffff08;
  reference in_stack_ffffffffffffff10;
  undefined7 in_stack_ffffffffffffff18;
  char *this_01;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *in_stack_ffffffffffffff68;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_ffffffffffffff70;
  
  ParamSurface::ParamSurface
            ((ParamSurface *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  *(undefined ***)in_RDI = &PTR_intersect_001e7f08;
  this_01 = "curve";
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::operator[]<char_const>(in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68);
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::operator[]<char_const>(in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)this_01,in_RDI);
  std::vector<vec3f,_std::allocator<vec3f>_>::vector
            ((vector<vec3f,_std::allocator<vec3f>_> *)0x179f3d);
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::operator[]<char_const>(in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68);
  this_00 = nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
            ::operator[]<char_const>(in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::begin((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           *)in_stack_fffffffffffffee8);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::end((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
         *)in_stack_fffffffffffffee8);
  while (uVar1 = nlohmann::detail::
                 iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 ::operator!=((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                               *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                              in_stack_fffffffffffffee8), (bool)uVar1) {
    in_stack_ffffffffffffff10 =
         nlohmann::detail::
         iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
         ::operator*(in_stack_ffffffffffffff68);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)this_01,in_RDI);
    vVar4 = json2vec3f((Json *)this_01);
    in_stack_fffffffffffffef4 = vVar4.z;
    in_stack_fffffffffffffef8._8_4_ = extraout_XMM0_Dc;
    in_stack_fffffffffffffef8._0_8_ = vVar4._0_8_;
    in_stack_fffffffffffffef8._12_4_ = extraout_XMM0_Dd;
    std::vector<vec3f,_std::allocator<vec3f>_>::push_back
              ((vector<vec3f,_std::allocator<vec3f>_> *)
               CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               (value_type *)in_stack_fffffffffffffee8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    nlohmann::detail::
    iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::operator++((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                  *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  }
  bVar2 = nlohmann::operator==<const_char_*,_0>(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08)
  ;
  if (bVar2) {
    pvVar3 = operator_new(0x20);
    BsplineCurve::BsplineCurve
              ((BsplineCurve *)this_00,
               (vector<vec3f,_std::allocator<vec3f>_> *)CONCAT17(uVar1,in_stack_ffffffffffffff18));
    *(void **)(in_RDI + 1) = pvVar3;
  }
  ParamSurface::buildmesh(in_stack_00000500);
  std::vector<vec3f,_std::allocator<vec3f>_>::~vector(in_stack_fffffffffffffef8._8_8_);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  return;
}

Assistant:

RevSurface(const Json& json)
	{
		auto curvetype = json["curve"]["type"];
		std::vector<vec3f> controls;
		for (auto p: json["curve"]["controls"])
			controls.push_back(json2vec3f(p));
		if (curvetype == "Bspline")
			curve = new BsplineCurve(controls);
		buildmesh();
	}